

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void CVmBifTADS::re_group(uint argc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  char *pcVar5;
  size_t sVar6;
  re_group_register *prVar7;
  size_t bytecnt;
  char *dst;
  char buf [17];
  
  CVmBif::check_argc(argc,1);
  iVar3 = CVmBif::pop_int_val();
  if (iVar3 == 0) {
    prVar7 = &G_bif_tads_globals_X->rex_searcher->match_;
  }
  else {
    if (iVar3 - 0xbU < 0xfffffff6) {
      err_throw(0x902);
    }
    if (G_bif_tads_globals_X->rex_searcher->group_cnt_ < iVar3) goto LAB_002229bc;
    prVar7 = (re_group_register *)
             (&(G_bif_tads_globals_X->rex_searcher->super_CRegexSearcher).field_0x24 +
             (ulong)(iVar3 - 1) * 8);
  }
  pcVar5 = vm_val_t::get_as_string(&G_bif_tads_globals_X->last_rex_str->val);
  if (((pcVar5 != (char *)0x0) &&
      (bytecnt = (size_t)prVar7->start_ofs, bytecnt != 0xffffffffffffffff)) &&
     (prVar7->end_ofs != -1)) {
    dst = buf + 2;
    buf[0] = '\x03';
    buf[1] = '\0';
    sVar6 = utf8_ptr::s_len(pcVar5 + 2,bytecnt);
    put_list_int(&dst,sVar6 + 1);
    sVar6 = utf8_ptr::s_len(pcVar5 + bytecnt + 2,(long)prVar7->end_ofs - (long)prVar7->start_ofs);
    put_list_int(&dst,sVar6);
    vVar4 = CVmObjString::create
                      (0,pcVar5 + bytecnt + 2,(long)prVar7->end_ofs - (long)prVar7->start_ofs);
    put_list_obj(&dst,vVar4);
    pvVar2 = sp_;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = vVar4;
    vVar4 = CVmObjList::create(0,buf);
    CVmBif::retval_obj(vVar4);
    sp_ = sp_ + -1;
    return;
  }
LAB_002229bc:
  CVmBif::retval_nil();
  return;
}

Assistant:

void CVmBifTADS::re_group(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* get the group number to retrieve */
    int groupno = pop_int_val(vmg0_);

    /* group 0 is the special group for the overall match */
    const re_group_register *reg;
    if (groupno == 0)
    {
        /* get the special register for the overall match */
        reg = G_bif_tads_globals->rex_searcher->get_last_match();
    }
    else
    {
        /* make sure it's in range */
        if (groupno < 1 || groupno > RE_GROUP_REG_CNT)
            err_throw(VMERR_BAD_VAL_BIF);
        
        /* adjust from a 1-base to a 0-base */
        --groupno;
        
        /* if the group doesn't exist in the pattern, return nil */
        if (groupno >= G_bif_tads_globals->rex_searcher->get_group_cnt())
        {
            retval_nil(vmg0_);
            return;
        }

        /* get the group register */
        reg = G_bif_tads_globals->rex_searcher->get_group_reg(groupno);
    }